

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void matras_create(matras *m,matras_id_t block_size,matras_allocator *allocator,matras_stats *stats)

{
  ulong uVar1;
  matras_id_t mVar2;
  matras_id_t mVar3;
  matras_stats *pmVar4;
  byte bVar5;
  matras_id_t mVar6;
  uint uVar7;
  char *__assertion;
  
  uVar1 = allocator->extent_size;
  if ((uVar1 & uVar1 - 1) == 0) {
    if ((block_size & block_size - 1) == 0) {
      if (uVar1 < block_size) {
        __assertion = "block_size <= extent_size";
        uVar7 = 0x38;
      }
      else {
        if (8 < uVar1) {
          (m->head).next_view = (matras_view *)0x0;
          (m->head).block_count = 0;
          (m->head).prev_view = (matras_view *)0x0;
          m->block_size = block_size;
          m->extent_size = (matras_id_t)uVar1;
          m->extent_count = 0;
          m->allocator = allocator;
          pmVar4 = (matras_stats *)__tls_get_addr(&PTR_0010dfc0);
          if (stats != (matras_stats *)0x0) {
            pmVar4 = stats;
          }
          m->stats = pmVar4;
          mVar2 = matras_log2((matras_id_t)uVar1);
          mVar3 = matras_log2(block_size);
          uVar7 = (mVar2 * 3 - mVar3) - 6;
          bVar5 = 0x20;
          if (uVar7 < 0x20) {
            bVar5 = (byte)uVar7;
          }
          m->capacity = 1L << (bVar5 & 0x3f);
          mVar6 = (mVar2 * 2 - mVar3) - 3;
          m->shift1 = mVar6;
          m->shift2 = mVar2 - mVar3;
          m->mask1 = ~(-1 << ((byte)mVar6 & 0x1f));
          m->mask2 = ~(-1 << ((byte)(mVar2 - mVar3) & 0x1f));
          return;
        }
        __assertion = "extent_size > sizeof(void *)";
        uVar7 = 0x3a;
      }
    }
    else {
      __assertion = "(block_size & (block_size - 1)) == 0";
      uVar7 = 0x36;
    }
  }
  else {
    __assertion = "(extent_size & (extent_size - 1)) == 0";
    uVar7 = 0x34;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                ,uVar7,
                "void matras_create(struct matras *, matras_id_t, struct matras_allocator *, struct matras_stats *)"
               );
}

Assistant:

void
matras_create(struct matras *m, matras_id_t block_size,
	      struct matras_allocator *allocator,
	      struct matras_stats *stats)
{
	size_t extent_size = allocator->extent_size;

	/*extent_size must be power of 2 */
	assert((extent_size & (extent_size - 1)) == 0);
	/*block_size must be power of 2 */
	assert((block_size & (block_size - 1)) == 0);
	/*block must be not greater than the extent*/
	assert(block_size <= extent_size);
	/*extent must be able to store at least two records*/
	assert(extent_size > sizeof(void *));

	m->head.block_count = 0;
	m->head.prev_view = 0;
	m->head.next_view = 0;
	m->block_size = block_size;
	m->extent_size = extent_size;
	m->extent_count = 0;
	m->allocator = allocator;
	m->stats = stats ? stats : &dummy_stats;

	matras_id_t log1 = matras_log2(extent_size);
	matras_id_t log2 = matras_log2(block_size);
	matras_id_t log3 = matras_log2(sizeof(void *));
	matras_id_t log2_capacity = log1 * 3 - log2 - log3 * 2;
	/*
	 * Given 32-bit block identifiers, the maximum possible number of
	 * provided blocks is 2^32.
	 */
	if (log2_capacity > 32)
		log2_capacity = 32;
	m->capacity = (size_t)1 << log2_capacity;
	m->shift1 = log1 * 2 - log2 - log3;
	m->shift2 = log1 - log2;
	m->mask1 = (((matras_id_t)1) << m->shift1) - ((matras_id_t)1);
	m->mask2 = (((matras_id_t)1) << m->shift2) - ((matras_id_t)1);
}